

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push.c
# Opt level: O0

void push0_pipe_ready(push0_pipe *p)

{
  _Bool _Var1;
  int iVar2;
  bool bVar3;
  size_t sStack_30;
  _Bool blocked;
  size_t l;
  nni_aio *a;
  nni_msg *m;
  push0_sock *s;
  push0_pipe *p_local;
  
  m = (nni_msg *)p->push;
  sStack_30 = 0;
  s = (push0_sock *)p;
  nni_mtx_lock((nni_mtx *)((long)&m->m_addr + 0x18));
  _Var1 = nni_lmq_full((nni_lmq *)m);
  bVar3 = false;
  if (_Var1) {
    iVar2 = nni_list_empty((nni_list *)&(m->m_body).ch_ptr);
    bVar3 = iVar2 != 0;
  }
  iVar2 = nni_lmq_get((nni_lmq *)m,(nng_msg **)&a);
  if (iVar2 == 0) {
    nni_aio_set_msg((nni_aio *)&s[2].m,(nni_msg *)a);
    nni_pipe_send((nni_pipe *)(s->wq).lmq_cap,(nni_aio *)&s[2].m);
    l = (size_t)nni_list_first((nni_list *)&m->m_body);
    if ((nni_aio *)l != (nni_aio *)0x0) {
      nni_aio_list_remove((nni_aio *)l);
      a = (nni_aio *)nni_aio_get_msg((nni_aio *)l);
      sStack_30 = nni_msg_len((nni_msg *)a);
      nni_lmq_put((nni_lmq *)m,(nng_msg *)a);
    }
  }
  else {
    l = (size_t)nni_list_first((nni_list *)&m->m_body);
    if ((nni_aio *)l == (nni_aio *)0x0) {
      nni_list_append((nni_list *)&(m->m_body).ch_ptr,s);
    }
    else {
      nni_aio_list_remove((nni_aio *)l);
      a = (nni_aio *)nni_aio_get_msg((nni_aio *)l);
      sStack_30 = nni_msg_len((nni_msg *)a);
      nni_aio_set_msg((nni_aio *)&s[2].m,(nni_msg *)a);
      nni_pipe_send((nni_pipe *)(s->wq).lmq_cap,(nni_aio *)&s[2].m);
    }
  }
  if ((bVar3) &&
     ((_Var1 = nni_lmq_full((nni_lmq *)m), !_Var1 ||
      (iVar2 = nni_list_empty((nni_list *)&(m->m_body).ch_ptr), iVar2 == 0)))) {
    nni_pollable_raise((nni_pollable *)((long)&m->m_addr + 8));
  }
  nni_mtx_unlock((nni_mtx *)((long)&m->m_addr + 0x18));
  if (l != 0) {
    nni_aio_set_msg((nni_aio *)l,(nni_msg *)0x0);
    nni_aio_finish_sync((nni_aio *)l,NNG_OK,sStack_30);
  }
  return;
}

Assistant:

static void
push0_pipe_ready(push0_pipe *p)
{
	push0_sock *s = p->push;
	nni_msg    *m;
	nni_aio    *a = NULL;
	size_t      l = 0;
	bool        blocked;

	nni_mtx_lock(&s->m);

	blocked = nni_lmq_full(&s->wq) && nni_list_empty(&s->pl);

	// if  message is waiting in the buffered queue
	// then we prefer that.
	if (nni_lmq_get(&s->wq, &m) == 0) {
		nni_aio_set_msg(&p->aio_send, m);
		nni_pipe_send(p->pipe, &p->aio_send);

		if ((a = nni_list_first(&s->aq)) != NULL) {
			nni_aio_list_remove(a);
			m = nni_aio_get_msg(a);
			l = nni_msg_len(m);
			nni_lmq_put(&s->wq, m);
		}

	} else if ((a = nni_list_first(&s->aq)) != NULL) {
		// Looks like we had the unbuffered case, but
		// someone was waiting.
		nni_aio_list_remove(a);
		m = nni_aio_get_msg(a);
		l = nni_msg_len(m);

		nni_aio_set_msg(&p->aio_send, m);
		nni_pipe_send(p->pipe, &p->aio_send);
	} else {
		// We had nothing to send.  Just put us in the ready list.
		nni_list_append(&s->pl, p);
	}

	if (blocked) {
		// if we blocked, then toggle the status.
		if ((!nni_lmq_full(&s->wq)) || (!nni_list_empty(&s->pl))) {
			nni_pollable_raise(&s->writable);
		}
	}

	nni_mtx_unlock(&s->m);

	if (a != NULL) {
		nni_aio_set_msg(a, NULL);
		nni_aio_finish_sync(a, 0, l);
	}
}